

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

void Pla_ManConvertFromBits(Pla_Man_t *p)

{
  word *pwVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  
  lVar4 = (long)(p->vCubeLits).nSize;
  if (0 < lVar4) {
    pVVar5 = (p->vCubeLits).pArray;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&pVVar5->nSize + lVar10) = 0;
      lVar10 = lVar10 + 0x10;
    } while (lVar4 * 0x10 != lVar10);
  }
  (p->vCubeLits).nSize = 0;
  lVar4 = (long)(p->vOccurs).nSize;
  if (0 < lVar4) {
    pVVar5 = (p->vOccurs).pArray;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)&pVVar5->nSize + lVar10) = 0;
      lVar10 = lVar10 + 0x10;
    } while (lVar4 * 0x10 != lVar10);
  }
  (p->vOccurs).nSize = 0;
  iVar17 = (p->vCubes).nSize;
  if ((p->vCubeLits).nCap < iVar17) {
    pVVar5 = (p->vCubeLits).pArray;
    sVar14 = (long)iVar17 << 4;
    if (pVVar5 == (Vec_Int_t *)0x0) {
      pVVar5 = (Vec_Int_t *)malloc(sVar14);
    }
    else {
      pVVar5 = (Vec_Int_t *)realloc(pVVar5,sVar14);
    }
    (p->vCubeLits).pArray = pVVar5;
    lVar4 = (long)(p->vCubeLits).nCap;
    memset(pVVar5 + lVar4,0,(iVar17 - lVar4) * 0x10);
    (p->vCubeLits).nCap = iVar17;
  }
  (p->vCubeLits).nSize = iVar17;
  iVar17 = p->nIns * 2;
  if ((p->vOccurs).nCap < iVar17) {
    pVVar5 = (p->vOccurs).pArray;
    sVar14 = (long)p->nIns << 5;
    if (pVVar5 == (Vec_Int_t *)0x0) {
      pVVar5 = (Vec_Int_t *)malloc(sVar14);
    }
    else {
      pVVar5 = (Vec_Int_t *)realloc(pVVar5,sVar14);
    }
    (p->vOccurs).pArray = pVVar5;
    lVar4 = (long)(p->vOccurs).nCap;
    memset(pVVar5 + lVar4,0,(iVar17 - lVar4) * 0x10);
    (p->vOccurs).nCap = iVar17;
  }
  (p->vOccurs).nSize = iVar17;
  if (0 < (p->vCubes).nSize) {
    lVar4 = 0;
    do {
      iVar17 = (int)lVar4;
      uVar2 = p->nInWords * iVar17;
      if (((int)uVar2 < 0) || ((p->vInBits).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((p->vCubeLits).nSize <= lVar4) {
LAB_003f8db2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pwVar1 = (p->vInBits).pArray;
      if (p->nIns < 1) {
        iVar11 = 0;
      }
      else {
        bVar9 = 0;
        iVar11 = 0;
        uVar7 = 0;
        do {
          iVar11 = (iVar11 + 1) -
                   (uint)((pwVar1[(ulong)uVar2 + (uVar7 >> 5)] >> (bVar9 & 0x3e) & 3) == 0);
          uVar13 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar13;
          bVar9 = bVar9 + 2;
        } while (p->nIns != uVar13);
      }
      pVVar5 = (p->vCubeLits).pArray + lVar4;
      if (pVVar5->nCap < iVar11) {
        if (pVVar5->pArray == (int *)0x0) {
          piVar6 = (int *)malloc((long)iVar11 << 2);
        }
        else {
          piVar6 = (int *)realloc(pVVar5->pArray,(long)iVar11 << 2);
        }
        pVVar5->pArray = piVar6;
        if (piVar6 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar5->nCap = iVar11;
      }
      if (0 < p->nIns) {
        uVar13 = iVar17 + 1;
        iVar11 = 0;
        uVar15 = 0;
        do {
          uVar7 = pwVar1[(ulong)uVar2 + (ulong)(uVar15 >> 5)] >> ((byte)iVar11 & 0x3e);
          if ((uVar7 & 3) != 0) {
            bVar18 = ((uint)uVar7 & 3) == 1;
            iVar3 = (p->vCubeLits).nSize;
            if (iVar3 <= lVar4) {
              uVar12 = iVar3 * 2;
              if ((int)uVar12 <= (int)uVar13) {
                uVar12 = uVar13;
              }
              if ((p->vCubeLits).nCap < (int)uVar12) {
                pVVar8 = (p->vCubeLits).pArray;
                if (pVVar8 == (Vec_Int_t *)0x0) {
                  pVVar8 = (Vec_Int_t *)malloc((ulong)uVar12 << 4);
                }
                else {
                  pVVar8 = (Vec_Int_t *)realloc(pVVar8,(ulong)uVar12 << 4);
                }
                (p->vCubeLits).pArray = pVVar8;
                lVar10 = (long)(p->vCubeLits).nCap;
                memset(pVVar8 + lVar10,0,((int)uVar12 - lVar10) * 0x10);
                (p->vCubeLits).nCap = uVar12;
              }
              (p->vCubeLits).nSize = uVar13;
            }
            if ((p->vCubeLits).nSize <= lVar4) goto LAB_003f8db2;
            uVar12 = (uint)bVar18 + iVar11;
            Vec_IntPush((p->vCubeLits).pArray + lVar4,uVar12);
            iVar3 = (p->vOccurs).nSize;
            if (iVar3 <= (int)uVar12) {
              iVar16 = (uint)bVar18 + iVar11 + 1;
              iVar3 = iVar3 * 2;
              if (iVar3 <= iVar16) {
                iVar3 = iVar16;
              }
              if ((p->vOccurs).nCap < iVar3) {
                pVVar8 = (p->vOccurs).pArray;
                sVar14 = (long)iVar3 << 4;
                if (pVVar8 == (Vec_Int_t *)0x0) {
                  pVVar8 = (Vec_Int_t *)malloc(sVar14);
                }
                else {
                  pVVar8 = (Vec_Int_t *)realloc(pVVar8,sVar14);
                }
                (p->vOccurs).pArray = pVVar8;
                lVar10 = (long)(p->vOccurs).nCap;
                memset(pVVar8 + lVar10,0,(iVar3 - lVar10) * 0x10);
                (p->vOccurs).nCap = iVar3;
              }
              (p->vOccurs).nSize = iVar16;
            }
            if ((iVar11 < 0) || ((p->vOccurs).nSize <= (int)uVar12)) goto LAB_003f8db2;
            Vec_IntPush((p->vOccurs).pArray + uVar12,iVar17);
          }
          uVar15 = uVar15 + 1;
          iVar11 = iVar11 + 2;
        } while ((int)uVar15 < p->nIns);
      }
      if (pVVar5->nSize != pVVar5->nCap) {
        __assert_fail("Vec_IntSize(vCube) == Vec_IntCap(vCube)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                      ,0xf8,"void Pla_ManConvertFromBits(Pla_Man_t *)");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vCubes).nSize);
  }
  return;
}

Assistant:

void Pla_ManConvertFromBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube;
    word * pCube; int i, k, Lit, Count;
    Vec_WecClear( &p->vCubeLits );
    Vec_WecClear( &p->vOccurs );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Pla_ForEachCubeIn( p, pCube, i )
    {
        vCube = Vec_WecEntry( &p->vCubeLits, i );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
                Count++;
        Vec_IntGrow( vCube, Count );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
//                Vec_WecPush( &p->vOccurs, Lit, Pla_CubeHandle(i, Count++) );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
        assert( Vec_IntSize(vCube) == Vec_IntCap(vCube) );
    }
}